

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O0

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  int res;
  TValue *r_local;
  TValue *l_local;
  lua_State *L_local;
  
  if (l->tt == r->tt) {
    if (l->tt == 3) {
      L_local._4_4_ = (uint)((l->value).n < (r->value).n);
    }
    else if (l->tt == 4) {
      iVar1 = l_strcmp(&((l->value).gc)->ts,&((r->value).gc)->ts);
      L_local._4_4_ = (uint)(iVar1 < 0);
    }
    else {
      L_local._4_4_ = call_orderTM(L,l,r,TM_LT);
      if (L_local._4_4_ == 0xffffffff) {
        L_local._4_4_ = luaG_ordererror(L,l,r);
      }
    }
  }
  else {
    L_local._4_4_ = luaG_ordererror(L,l,r);
  }
  return L_local._4_4_;
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttype(l) != ttype(r))
    return luaG_ordererror(L, l, r);
  else if (ttisnumber(l))
    return luai_numlt(nvalue(l), nvalue(r));
  else if (ttisstring(l))
    return l_strcmp(rawtsvalue(l), rawtsvalue(r)) < 0;
  else if ((res = call_orderTM(L, l, r, TM_LT)) != -1)
    return res;
  return luaG_ordererror(L, l, r);
}